

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall TestMaterial::TestAnimation(TestMaterial *this)

{
  double *pdVar1;
  Vector3T *pVVar2;
  ostream *poVar3;
  clock_t cVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint k;
  int a;
  ulong uVar9;
  long lVar10;
  uint j;
  int b;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  double angle;
  value_type local_118;
  ulong local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  clock_t local_d0;
  long local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  long local_a8;
  ulong local_a0;
  Vector3T<double,_false> vr;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  oldPos;
  Point3 p2;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"TestAnimation");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_118.m_x = 3.0;
  local_118.m_y = 3.0;
  local_118.m_z = 3.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_d8 = 1.0;
  angle = 0.0;
  oldPos.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  oldPos.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  oldPos.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar11 = -2;
  lVar8 = -3;
  uVar5 = 0;
  uVar6 = 0;
  uVar9 = 0;
  while( true ) {
    if ((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) <= uVar9) break;
    local_118.m_x = (double)(long)(lVar11 + (uVar6 / 5) * -5) * 0.2;
    local_118.m_y = (double)(long)(lVar8 + (uVar5 / 6) * -6) * 0.8333333333333334 * 0.2;
    local_118.m_z = (double)(long)(lVar8 + (uVar5 / 7) * -7) * 0.7142857142857143 * 0.2;
    std::
    vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
    ::push_back(&oldPos,&local_118);
    sch::S_Object::setOrientation
              (*(double **)(*(long *)&this->field_0x8 + uVar9 * 8),(Vector3T *)&angle);
    sch::S_Object::setPosition(*(Vector3T **)(*(long *)&this->field_0x8 + uVar9 * 8));
    uVar9 = uVar9 + 1;
    lVar11 = lVar11 + 7;
    uVar6 = uVar6 + 7;
    lVar8 = lVar8 + 5;
    uVar5 = uVar5 + 5;
  }
  sch::CD_Scene::sceneProximityQuery();
  display();
  local_d0 = clock();
  lVar11 = 0;
  while (lVar11 != 10000) {
    local_c0 = (double)lVar11;
    dVar12 = local_c0 * 0.0006000000000000001;
    local_b0 = local_c0 * 0.00030000000000000003;
    local_b8 = local_c0 * 0.0015;
    local_c0 = local_c0 * 0.00045;
    uVar5 = 0;
    lVar8 = 0x14;
    lVar10 = 0;
    uVar6 = 0;
    lVar7 = lVar8;
    local_c8 = lVar11;
    while( true ) {
      if ((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) <= uVar6) break;
      pdVar1 = (double *)
               ((long)oldPos.
                      super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + -0xa0);
      local_118.m_x = *pdVar1;
      local_118.m_y = pdVar1[1];
      local_118.m_z =
           (&oldPos.
             super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-6].m_x)[lVar8];
      auVar17._8_4_ = (int)(uVar6 >> 0x20);
      auVar17._0_8_ = uVar6;
      auVar17._12_4_ = 0x45300000;
      dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
      local_100 = uVar6;
      local_a8 = lVar8;
      local_a0 = uVar5;
      dVar13 = sin(dVar12);
      local_e8 = sin(dVar13 * (dVar16 + 42.0));
      dVar13 = sin(dVar12);
      dStack_e0 = sin(dVar13 * (-43.0 - dVar16));
      dVar13 = sin(local_b0);
      local_d8 = cos(dVar13 * (dVar16 + 83.0));
      dVar13 = sin(local_b8);
      dVar13 = sin(dVar13 * 0.2);
      dVar13 = sin(dVar13 * (97.0 - dVar16));
      angle = dVar13 * 4.0;
      sch::S_Object::setOrientation
                (*(double **)(*(long *)&this->field_0x8 + lVar10 * 4),(Vector3T *)&angle);
      uVar9 = local_100;
      lVar8 = lVar7 + (uVar5 / 7) * -0x23;
      lVar11 = (uVar6 / 3) * -3 + 1 + local_100;
      pVVar2 = *(Vector3T **)(*(long *)&this->field_0x8 + lVar10 * 4);
      dVar13 = sin(dVar12);
      dVar13 = sin(dVar13 * ((double)lVar11 * 20.0 + dVar16 + dVar16));
      lVar11 = lVar10 + 0xd3;
      if ((uVar9 & 1) != 0) {
        lVar11 = lVar10 + 0x47;
      }
      auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = 0x45300000;
      dStack_f0 = auVar14._8_8_ - 1.9342813113834067e+25;
      local_f8 = dStack_f0 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
      dVar16 = sin(local_c0);
      local_f8 = sin(dVar16 * local_f8);
      auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar15._0_8_ = lVar8;
      auVar15._12_4_ = 0x45300000;
      dVar16 = sin(dVar12);
      dVar16 = sin(dVar16 * ((auVar15._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
      vr.m_x = dVar13 * 0.6 + local_118.m_x;
      vr.m_y = local_f8 * 0.6 + local_118.m_y;
      vr.m_z = dVar16 * 0.6 + local_118.m_z;
      sch::S_Object::setPosition(pVVar2);
      uVar6 = local_100 + 1;
      lVar10 = lVar10 + 2;
      lVar8 = local_a8 + 3;
      lVar7 = lVar7 + 0x1c;
      uVar5 = local_a0 + 5;
    }
    sch::CD_Scene::sceneProximityQuery();
    uVar5 = 0;
    while (a = (int)uVar5,
          uVar5 < (ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3)) {
      for (b = 0; a != b; b = b + 1) {
        vr.m_x = 0.0;
        vr.m_y = 0.0;
        vr.m_z = 0.0;
        p2.m_x = 0.0;
        p2.m_y = 0.0;
        p2.m_z = 0.0;
        sch::CD_Scene::getWitnessPoints(&this->sObj,a,b,&vr,&p2);
      }
      uVar5 = (ulong)(a + 1);
    }
    display();
    lVar11 = local_c8 + 1;
  }
  cVar4 = clock();
  std::operator<<((ostream *)&std::cout,"  computation time: ");
  dVar12 = (double)(cVar4 - local_d0) / 1000000.0;
  poVar3 = std::ostream::_M_insert<double>(dVar12);
  std::operator<<(poVar3," : ");
  poVar3 = std::ostream::_M_insert<double>(dVar12 / 10000.0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  _Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ::~_Vector_base(&oldPos.
                   super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                 );
  return;
}

Assistant:

void TestMaterial::TestAnimation()
{
  std::cout << "TestAnimation" << std::endl;
  Vector3 position(3, 3, 3);
  Vector3 axe(0, 0, 1);
  double angle(0);

  std::vector<Vector3> oldPos;

  for (size_t i=0; i<sObj.size(); i++)
  {
    position[0] =(Scalar(7*i%5)-2.)*DispersionScale;
    position[1] =((Scalar(5*i%6)-3.)*(5.0/6.))*DispersionScale;
    position[2] =((Scalar(5*i%7)-3.)*(5.0/7.))*DispersionScale;

    oldPos.push_back(position);

    sObj[i]->setOrientation(angle,axe);
    sObj[i]->setPosition(position);
  }

#ifdef DO_TEST
  sObj.sceneProximityQuery();
#endif

  display();

  clock_t begin, end;



# ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_animationtest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
# endif


#ifdef IRREGULARITIES_COUNTERS
  Scalar previousDistance=2e90;
  int irrCpt=0;
#endif

#ifdef COLLISION_COUNTERS
  int collCpt=0;
  int totalCpt=0;
#endif

  begin=clock();

  for (long i=0; i<AnimationEnd; i++)
  {
    for (size_t j=0; j<sObj.size(); j++)
    {
      position=oldPos[j];

      Scalar is= Scalar(i), js = Scalar(j);


      axe[0] =  sin((42+js)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43-js)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83+js)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97-js)*sin(0.2*sin(0.5*AnimationSpeed*is)));


      sObj[j]->setOrientation(angle,axe);

      sObj[j]->setPosition( position + Vector3(sin((20*Scalar(j%3+1)+2*js)*sin(0.2*AnimationSpeed*is)),
                            sin(Scalar(71-140*(j%2-1)+2*j)*sin(0.15*AnimationSpeed*is)),
                            sin(Scalar(20+((j*5)%7)*5+3*j)*sin(0.2*AnimationSpeed*is)))*AnimationScale);
    }



#ifdef DO_TEST
    sObj.sceneProximityQuery();

    for (unsigned k=0; k<sObj.size(); k++)
    {
      for (unsigned j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
# ifndef OUTPUT_FILE        
        (void) distance; ///prevent warning about unused variable
# else
        outfile<<p1<<p2<<distance<<std::endl;
# endif
      }
    }

# ifdef IRREGULARITIES_COUNTERS
    Point3 p1,p2;
    Scalar distance=sObj.getWitnessPoints(0,1,p1,p2);
    Scalar distance2=(p1-p2).normsquared();
    if (previousDistance!=2e90)
    {
      if (fabs(fabs(distance)-distance2)>(0.001*(fabs(distance)+distance2)/2))
      {
        irrCpt++;
        std::cout<<"Witness Points Irregularity : "<<i<<' '<<distance<<' '<<distance2<<std::endl;
      }
      if (fabs(distance-previousDistance)>0.1)
      {
        irrCpt++;
        std::cout<<"Coherence Irregularity : "<<i;
      }
    }
    previousDistance=distance;
# endif // IRREGULARITIES_COUNTERS




# ifdef COLLISION_COUNTERS
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        if (distance<0)
          collCpt++;
        totalCpt++;
      }
    }
# endif

#endif


#ifdef TEST_HOLD
    std::cout<<i<<std::endl;
    system("pause");
#endif


#ifdef DISPLAY_DISTANCE
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        std::cout<<distance<<std::endl;
      }
    }
#endif

    display();
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) << " : " << ((double)(end - begin) / CLOCKS_PER_SEC)/(AnimationEnd) << std::endl;

#ifdef IRREGULARITIES_COUNTERS
  std::cout<<"Irregularities : "<<irrCpt<<std::endl;
  outfile  <<"Irregularities : "<<irrCpt<<std::endl;
#endif


#ifdef COLLISION_COUNTERS
  std::cout << "Collisions : "<<collCpt<< " Total pairs checked : "<<totalCpt<<std::endl;
  outfile   << "Collisions : "<<collCpt<< " Total pairs checked : "<<totalCpt<<std::endl;
#endif

#ifdef OUTPUT_FILE
  outfile.close();
#endif

}